

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall cmNinjaTargetGenerator::WriteCompileRule(cmNinjaTargetGenerator *this,string *lang)

{
  pointer *ppbVar1;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar2;
  cmGeneratorTarget *pcVar3;
  pointer pcVar4;
  size_type sVar5;
  pointer pbVar6;
  bool bVar7;
  TargetType targetType;
  int iVar8;
  int iVar9;
  int iVar10;
  string *psVar11;
  long *plVar12;
  undefined4 extraout_var;
  char *pcVar13;
  ostream *poVar14;
  cmGlobalNinjaGenerator *pcVar15;
  char *__s;
  char *__s_00;
  char *__s_01;
  size_t sVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  size_type *psVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  undefined8 uVar21;
  cmOutputConverter *pcVar22;
  _Alloc_hider _Var23;
  string *i;
  pointer pbVar24;
  string local_7c8;
  string cmdLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string ppRspFile;
  string ppCmdLine;
  string run_iwyu;
  string compilerLauncher;
  string cldeps;
  string depfile;
  string deptype;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string rspcontent;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string flags;
  ostringstream comment;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8 [6];
  ios_base local_588 [264];
  string responseFlag;
  string launcher;
  ostringstream description;
  size_type local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430 [6];
  ios_base local_3d0 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ppCmds;
  string tdi;
  string rspfile;
  RuleVariables vars;
  
  cmRulePlaceholderExpander::RuleVariables::RuleVariables(&vars);
  psVar11 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  vars.CMTargetName = (psVar11->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  vars.CMTargetType = cmState::GetTargetTypeName(targetType);
  vars.Language = (lang->_M_dataplus)._M_p;
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";
  iVar8 = std::__cxx11::string::compare((char *)lang);
  if (iVar8 == 0) {
    vars.SwiftAuxiliarySources = "$SWIFT_AUXILIARY_SOURCES";
    vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
    vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
    vars.SwiftPartialModule = "$SWIFT_PARTIAL_MODULE";
    vars.SwiftPartialDoc = "$SWIFT_PARTIAL_DOC";
  }
  iVar8 = std::__cxx11::string::compare((char *)lang);
  iVar9 = std::__cxx11::string::compare((char *)lang);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  flags._M_dataplus._M_p = (pointer)&flags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flags,"$FLAGS","");
  responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
  responseFlag._M_string_length = 0;
  responseFlag.field_2._M_local_buf[0] = '\0';
  iVar10 = std::__cxx11::string::compare((char *)lang);
  if (((iVar10 != 0) && (iVar10 = std::__cxx11::string::compare((char *)lang), iVar10 != 0)) &&
     (bVar7 = ForceResponseFile(this), bVar7)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,"CMAKE_",lang);
    plVar12 = (long *)std::__cxx11::string::append((char *)&description);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar17) {
      local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_5e8[0]._8_8_ = plVar12[3];
      _comment = (pointer)local_5e8;
    }
    else {
      local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
      _comment = (pointer)*plVar12;
    }
    *plVar12 = (long)paVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    cmMakefile::GetSafeDefinition((this->super_cmCommonTargetGenerator).Makefile,(string *)&comment)
    ;
    std::__cxx11::string::_M_assign((string *)&responseFlag);
    if (responseFlag._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&responseFlag,0,(char *)0x0,0x59c6a2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_5e8) {
      operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
    }
  }
  rulePlaceholderExpander._M_t.
  super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
  .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._0_4_ =
       (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
         _vptr_cmLocalGenerator[5])();
  rulePlaceholderExpander._M_t.
  super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
  .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._4_4_ = extraout_var;
  pcVar2 = this->LocalGenerator;
  GetTargetDependInfoPath((string *)&description,this,lang);
  ConvertToNinjaPath((string *)&comment,this,(string *)&description);
  cmOutputConverter::ConvertToOutputFormat
            (&tdi,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter,(string *)&comment,SHELL);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_5e8) {
    operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_description != local_430) {
    operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
  }
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  launcher.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  _comment = (pointer)local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"RULE_LAUNCH_COMPILE","");
  pcVar13 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar2,pcVar3,(string *)&comment);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_5e8) {
    operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
  }
  sVar5 = launcher._M_string_length;
  if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
    strlen(pcVar13);
    std::__cxx11::string::_M_replace((ulong)&launcher,0,(char *)sVar5,(ulong)pcVar13);
    std::__cxx11::string::append((char *)&launcher);
  }
  if (iVar8 == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   "CMAKE_",lang);
    plVar12 = (long *)std::__cxx11::string::append((char *)&comment);
    rspcontent._M_dataplus._M_p = (pointer)&rspcontent.field_2;
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      rspcontent.field_2._M_allocated_capacity = *psVar18;
      rspcontent.field_2._8_8_ = plVar12[3];
    }
    else {
      rspcontent.field_2._M_allocated_capacity = *psVar18;
      rspcontent._M_dataplus._M_p = (pointer)*plVar12;
    }
    rspcontent._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_5e8) {
      operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
    }
    psVar11 = cmMakefile::GetRequiredDefinition
                        ((this->super_cmCommonTargetGenerator).Makefile,&rspcontent);
    deptype._M_dataplus._M_p = (pointer)&deptype.field_2;
    deptype._M_string_length = 0;
    deptype.field_2._M_allocated_capacity =
         deptype.field_2._M_allocated_capacity & 0xffffffffffffff00;
    depfile._M_dataplus._M_p = (pointer)&depfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&depfile,"$DEP_FILE","");
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)&rspfile);
    rspfile._M_dataplus._M_p = vars.CMTargetName;
    rspfile._M_string_length = (size_type)vars.CMTargetType;
    vars.Source = "$in";
    cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&cldeps,flags._M_dataplus._M_p,
               flags._M_dataplus._M_p + flags._M_string_length);
    vars.Defines = "";
    ppRspFile._M_dataplus._M_p = (pointer)&ppRspFile.field_2;
    ppRspFile._M_string_length = 0;
    ppRspFile.field_2._M_allocated_capacity =
         ppRspFile.field_2._M_allocated_capacity & 0xffffffffffffff00;
    compilerLauncher._M_dataplus._M_p = (pointer)&compilerLauncher.field_2;
    compilerLauncher._M_string_length = 0;
    compilerLauncher.field_2._M_allocated_capacity =
         compilerLauncher.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (responseFlag._M_string_length != 0) {
      std::__cxx11::string::_M_replace((ulong)&ppRspFile,0,(char *)0x0,0x55d747);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8," ","");
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_7c8);
      run_iwyu._M_dataplus._M_p = (pointer)&run_iwyu.field_2;
      psVar18 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar18) {
        run_iwyu.field_2._M_allocated_capacity = *psVar18;
        run_iwyu.field_2._8_8_ = plVar12[3];
      }
      else {
        run_iwyu.field_2._M_allocated_capacity = *psVar18;
        run_iwyu._M_dataplus._M_p = (pointer)*plVar12;
      }
      run_iwyu._M_string_length = plVar12[1];
      *plVar12 = (long)psVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&run_iwyu);
      psVar18 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar18) {
        ppCmdLine.field_2._M_allocated_capacity = *psVar18;
        ppCmdLine.field_2._8_8_ = plVar12[3];
        ppCmdLine._M_dataplus._M_p = (pointer)&ppCmdLine.field_2;
      }
      else {
        ppCmdLine.field_2._M_allocated_capacity = *psVar18;
        ppCmdLine._M_dataplus._M_p = (pointer)*plVar12;
      }
      ppCmdLine._M_string_length = plVar12[1];
      *plVar12 = (long)psVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&ppCmdLine);
      psVar18 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar18) {
        cmdLine.field_2._M_allocated_capacity = *psVar18;
        cmdLine.field_2._8_8_ = plVar12[3];
        cmdLine._M_dataplus._M_p = (pointer)&cmdLine.field_2;
      }
      else {
        cmdLine.field_2._M_allocated_capacity = *psVar18;
        cmdLine._M_dataplus._M_p = (pointer)*plVar12;
      }
      cmdLine._M_string_length = plVar12[1];
      *plVar12 = (long)psVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&cmdLine);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar17) {
        local_430[0]._0_8_ = paVar17->_M_allocated_capacity;
        local_430[0]._8_8_ = plVar12[3];
        _description = (pointer)local_430;
      }
      else {
        local_430[0]._0_8_ = paVar17->_M_allocated_capacity;
        _description = (pointer)*plVar12;
      }
      *plVar12 = (long)paVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&description,(ulong)cldeps._M_dataplus._M_p);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar17) {
        local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
        local_5e8[0]._8_8_ = plVar12[3];
        _comment = (pointer)local_5e8;
      }
      else {
        local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
        _comment = (pointer)*plVar12;
      }
      *plVar12 = (long)paVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)&compilerLauncher,(string *)&comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_comment != local_5e8) {
        operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_430) {
        operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
        operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppCmdLine._M_dataplus._M_p != &ppCmdLine.field_2) {
        operator_delete(ppCmdLine._M_dataplus._M_p,ppCmdLine.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)run_iwyu._M_dataplus._M_p != &run_iwyu.field_2) {
        operator_delete(run_iwyu._M_dataplus._M_p,run_iwyu.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     &responseFlag,&ppRspFile);
      std::__cxx11::string::operator=((string *)&cldeps,(string *)&comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_comment != local_5e8) {
        operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
      }
    }
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ExpandListArgument(psVar11,&ppCmds,false);
    pbVar6 = ppCmds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        ppCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar24 = ppCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                       ,&launcher,pbVar24);
        std::__cxx11::string::operator=((string *)pbVar24,(string *)&comment);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_comment != local_5e8) {
          operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
        }
        pcVar22 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
        if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
          pcVar22 = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  ((cmRulePlaceholderExpander *)
                   rulePlaceholderExpander._M_t.
                   super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                   .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,pcVar22,
                   pbVar24,(RuleVariables *)&rspfile);
        pbVar24 = pbVar24 + 1;
      } while (pbVar24 != pbVar6);
    }
    pcVar2 = this->LocalGenerator;
    psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              (&cmdLine,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter,psVar11,SHELL);
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,cmdLine._M_dataplus._M_p,
               cmdLine._M_dataplus._M_p + cmdLine._M_string_length);
    std::__cxx11::string::append((char *)&__str);
    plVar12 = (long *)std::__cxx11::string::_M_append((char *)&__str,(ulong)tdi._M_dataplus._M_p);
    paVar17 = &local_7c8.field_2;
    psVar18 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_7c8.field_2._M_allocated_capacity = *psVar18;
      local_7c8.field_2._8_8_ = plVar12[3];
      local_7c8._M_dataplus._M_p = (pointer)paVar17;
    }
    else {
      local_7c8.field_2._M_allocated_capacity = *psVar18;
      local_7c8._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_7c8._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_7c8);
    paVar20 = &run_iwyu.field_2;
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      run_iwyu.field_2._M_allocated_capacity = *psVar18;
      run_iwyu.field_2._8_8_ = plVar12[3];
      run_iwyu._M_dataplus._M_p = (pointer)paVar20;
    }
    else {
      run_iwyu.field_2._M_allocated_capacity = *psVar18;
      run_iwyu._M_dataplus._M_p = (pointer)*plVar12;
    }
    run_iwyu._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&run_iwyu,(ulong)(lang->_M_dataplus)._M_p);
    ppCmdLine._M_dataplus._M_p = (pointer)&ppCmdLine.field_2;
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      ppCmdLine.field_2._M_allocated_capacity = *psVar18;
      ppCmdLine.field_2._8_8_ = plVar12[3];
    }
    else {
      ppCmdLine.field_2._M_allocated_capacity = *psVar18;
      ppCmdLine._M_dataplus._M_p = (pointer)*plVar12;
    }
    ppCmdLine._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&ppCmdLine);
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar19) {
      local_430[0]._0_8_ = paVar19->_M_allocated_capacity;
      local_430[0]._8_8_ = plVar12[3];
      _description = (pointer)local_430;
    }
    else {
      local_430[0]._0_8_ = paVar19->_M_allocated_capacity;
      _description = (pointer)*plVar12;
    }
    local_438 = plVar12[1];
    *plVar12 = (long)paVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&description);
    _comment = (pointer)local_5e8;
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar19) {
      local_5e8[0]._0_8_ = paVar19->_M_allocated_capacity;
      local_5e8[0]._8_8_ = plVar12[3];
    }
    else {
      local_5e8[0]._0_8_ = paVar19->_M_allocated_capacity;
      _comment = (pointer)*plVar12;
    }
    *plVar12 = (long)paVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ppCmds,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_5e8) {
      operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppCmdLine._M_dataplus._M_p != &ppCmdLine.field_2) {
      operator_delete(ppCmdLine._M_dataplus._M_p,ppCmdLine.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)run_iwyu._M_dataplus._M_p != paVar20) {
      operator_delete(run_iwyu._M_dataplus._M_p,run_iwyu.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != paVar17) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    local_5e8[0]._M_allocated_capacity = local_5e8[0]._M_allocated_capacity & 0xffffffffffffff00;
    _comment = (pointer)local_5e8;
    cmLocalNinjaGenerator::BuildCommandLine
              (&ppCmdLine,this->LocalGenerator,&ppCmds,(string *)&comment,(cmGeneratorTarget *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_5e8) {
      operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&comment,"Rule for preprocessing ",0x17);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&comment,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," files.",7);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&description,"Building ",9);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&description,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," preprocessed $out",0x12);
    pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    LanguagePreprocessRule(&run_iwyu,this,lang);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    ppbVar1 = &compileCmds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    compileCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&compileCmds,"");
    cmGlobalNinjaGenerator::AddRule
              (pcVar15,&run_iwyu,&ppCmdLine,&local_7c8,&__str,&depfile,&deptype,&ppRspFile,
               &compilerLauncher,(string *)&compileCmds,false);
    if (compileCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
      operator_delete(compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((compileCmds.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != paVar17) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)run_iwyu._M_dataplus._M_p != paVar20) {
      operator_delete(run_iwyu._M_dataplus._M_p,run_iwyu.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::ios_base::~ios_base(local_3d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::ios_base::~ios_base(local_588);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppCmdLine._M_dataplus._M_p != &ppCmdLine.field_2) {
      operator_delete(ppCmdLine._M_dataplus._M_p,ppCmdLine.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
      operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppCmds);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compilerLauncher._M_dataplus._M_p != &compilerLauncher.field_2) {
      operator_delete(compilerLauncher._M_dataplus._M_p,
                      compilerLauncher.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != &ppRspFile.field_2) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cldeps._M_dataplus._M_p != &cldeps.field_2) {
      operator_delete(cldeps._M_dataplus._M_p,cldeps.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)depfile._M_dataplus._M_p != &depfile.field_2) {
      operator_delete(depfile._M_dataplus._M_p,depfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)deptype._M_dataplus._M_p != &deptype.field_2) {
      operator_delete(deptype._M_dataplus._M_p,deptype.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspcontent._M_dataplus._M_p != &rspcontent.field_2) {
      operator_delete(rspcontent._M_dataplus._M_p,rspcontent.field_2._M_allocated_capacity + 1);
    }
  }
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  if (iVar9 == 0) {
    __str._M_dataplus._M_p = (pointer)0x0;
    __str._M_string_length = 0;
    __str.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"$out.rsp","");
    rspcontent._M_dataplus._M_p = (pointer)&rspcontent.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspcontent,"$in","");
    std::operator+(&deptype,"@",&rspfile);
    pcVar2 = this->LocalGenerator;
    psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              (&depfile,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter,psVar11,SHELL);
    cmdLine._M_dataplus._M_p = (pointer)&cmdLine.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&cmdLine,depfile._M_dataplus._M_p,
               depfile._M_dataplus._M_p + depfile._M_string_length);
    std::__cxx11::string::append((char *)&cmdLine);
    plVar12 = (long *)std::__cxx11::string::_M_append((char *)&cmdLine,(ulong)tdi._M_dataplus._M_p);
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      compilerLauncher.field_2._M_allocated_capacity = *psVar18;
      compilerLauncher.field_2._8_8_ = plVar12[3];
      compilerLauncher._M_dataplus._M_p = (pointer)&compilerLauncher.field_2;
    }
    else {
      compilerLauncher.field_2._M_allocated_capacity = *psVar18;
      compilerLauncher._M_dataplus._M_p = (pointer)*plVar12;
    }
    compilerLauncher._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&compilerLauncher);
    ppRspFile._M_dataplus._M_p = (pointer)&ppRspFile.field_2;
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      ppRspFile.field_2._M_allocated_capacity = *psVar18;
      ppRspFile.field_2._8_8_ = plVar12[3];
    }
    else {
      ppRspFile.field_2._M_allocated_capacity = *psVar18;
      ppRspFile._M_dataplus._M_p = (pointer)*plVar12;
    }
    ppRspFile._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&ppRspFile,(ulong)(lang->_M_dataplus)._M_p);
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      cldeps.field_2._M_allocated_capacity = *psVar18;
      cldeps.field_2._8_8_ = plVar12[3];
      cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
    }
    else {
      cldeps.field_2._M_allocated_capacity = *psVar18;
      cldeps._M_dataplus._M_p = (pointer)*plVar12;
    }
    cldeps._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&cldeps);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar17) {
      local_430[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_430[0]._8_8_ = plVar12[3];
      _description = (pointer)local_430;
    }
    else {
      local_430[0]._0_8_ = paVar17->_M_allocated_capacity;
      _description = (pointer)*plVar12;
    }
    local_438 = plVar12[1];
    *plVar12 = (long)paVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&description,(ulong)deptype._M_dataplus._M_p);
    _comment = (pointer)local_5e8;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar17) {
      local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_5e8[0]._8_8_ = plVar12[3];
    }
    else {
      local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
      _comment = (pointer)*plVar12;
    }
    *plVar12 = (long)paVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_5e8) {
      operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cldeps._M_dataplus._M_p != &cldeps.field_2) {
      operator_delete(cldeps._M_dataplus._M_p,cldeps.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != &ppRspFile.field_2) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compilerLauncher._M_dataplus._M_p != &compilerLauncher.field_2) {
      operator_delete(compilerLauncher._M_dataplus._M_p,
                      compilerLauncher.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
      operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
    }
    local_5e8[0]._M_allocated_capacity = local_5e8[0]._M_allocated_capacity & 0xffffffffffffff00;
    _comment = (pointer)local_5e8;
    cmLocalNinjaGenerator::BuildCommandLine
              (&cldeps,this->LocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__str,(string *)&comment,(cmGeneratorTarget *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_5e8) {
      operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&comment,"Rule to generate ninja dyndep files for ",0x28);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&comment,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,".",1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&description,"Generating ",0xb);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&description,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," dyndep file $out",0x11);
    pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    LanguageDyndepRule(&ppRspFile,this,lang);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    ppCmdLine._M_dataplus._M_p = (pointer)&ppCmdLine.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppCmdLine,"");
    run_iwyu._M_dataplus._M_p = (pointer)&run_iwyu.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&run_iwyu,"");
    local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"");
    cmGlobalNinjaGenerator::AddRule
              (pcVar15,&ppRspFile,&cldeps,&compilerLauncher,&cmdLine,&ppCmdLine,&run_iwyu,&rspfile,
               &rspcontent,&local_7c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)run_iwyu._M_dataplus._M_p != &run_iwyu.field_2) {
      operator_delete(run_iwyu._M_dataplus._M_p,run_iwyu.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppCmdLine._M_dataplus._M_p != &ppCmdLine.field_2) {
      operator_delete(ppCmdLine._M_dataplus._M_p,ppCmdLine.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
      operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compilerLauncher._M_dataplus._M_p != &compilerLauncher.field_2) {
      operator_delete(compilerLauncher._M_dataplus._M_p,
                      compilerLauncher.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != &ppRspFile.field_2) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::ios_base::~ios_base(local_3d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::ios_base::~ios_base(local_588);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cldeps._M_dataplus._M_p != &cldeps.field_2) {
      operator_delete(cldeps._M_dataplus._M_p,cldeps.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)depfile._M_dataplus._M_p != &depfile.field_2) {
      operator_delete(depfile._M_dataplus._M_p,depfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)deptype._M_dataplus._M_p != &deptype.field_2) {
      operator_delete(deptype._M_dataplus._M_p,deptype.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspcontent._M_dataplus._M_p != &rspcontent.field_2) {
      operator_delete(rspcontent._M_dataplus._M_p,rspcontent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,
                      CONCAT71(rspfile.field_2._M_allocated_capacity._1_7_,
                               rspfile.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__str);
  }
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  rspfile._M_string_length = 0;
  rspfile.field_2._M_local_buf[0] = '\0';
  rspcontent._M_dataplus._M_p = (pointer)&rspcontent.field_2;
  rspcontent._M_string_length = 0;
  rspcontent.field_2._M_allocated_capacity =
       rspcontent.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (responseFlag._M_string_length != 0) {
    std::__cxx11::string::_M_replace((ulong)&rspfile,0,(char *)0x0,0x55d747);
    ppRspFile._M_dataplus._M_p = (pointer)&ppRspFile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile," ","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&ppRspFile);
    cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      cldeps.field_2._M_allocated_capacity = *psVar18;
      cldeps.field_2._8_8_ = plVar12[3];
    }
    else {
      cldeps.field_2._M_allocated_capacity = *psVar18;
      cldeps._M_dataplus._M_p = (pointer)*plVar12;
    }
    cldeps._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&cldeps);
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      depfile.field_2._M_allocated_capacity = *psVar18;
      depfile.field_2._8_8_ = plVar12[3];
      depfile._M_dataplus._M_p = (pointer)&depfile.field_2;
    }
    else {
      depfile.field_2._M_allocated_capacity = *psVar18;
      depfile._M_dataplus._M_p = (pointer)*plVar12;
    }
    depfile._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&depfile);
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      deptype.field_2._M_allocated_capacity = *psVar18;
      deptype.field_2._8_8_ = plVar12[3];
      deptype._M_dataplus._M_p = (pointer)&deptype.field_2;
    }
    else {
      deptype.field_2._M_allocated_capacity = *psVar18;
      deptype._M_dataplus._M_p = (pointer)*plVar12;
    }
    deptype._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&deptype);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar17) {
      local_430[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_430[0]._8_8_ = plVar12[3];
      _description = (pointer)local_430;
    }
    else {
      local_430[0]._0_8_ = paVar17->_M_allocated_capacity;
      _description = (pointer)*plVar12;
    }
    local_438 = plVar12[1];
    *plVar12 = (long)paVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&description,(ulong)flags._M_dataplus._M_p);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar17) {
      local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_5e8[0]._8_8_ = plVar12[3];
      _comment = (pointer)local_5e8;
    }
    else {
      local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
      _comment = (pointer)*plVar12;
    }
    *plVar12 = (long)paVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::operator=((string *)&rspcontent,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_5e8) {
      operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)deptype._M_dataplus._M_p != &deptype.field_2) {
      operator_delete(deptype._M_dataplus._M_p,deptype.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)depfile._M_dataplus._M_p != &depfile.field_2) {
      operator_delete(depfile._M_dataplus._M_p,depfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cldeps._M_dataplus._M_p != &cldeps.field_2) {
      operator_delete(cldeps._M_dataplus._M_p,cldeps.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != &ppRspFile.field_2) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   &responseFlag,&rspfile);
    std::__cxx11::string::operator=((string *)&flags,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_5e8) {
      operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
    }
    vars.Defines = "";
    vars.Includes = "";
  }
  deptype._M_dataplus._M_p = (pointer)&deptype.field_2;
  deptype._M_string_length = 0;
  deptype.field_2._M_allocated_capacity = deptype.field_2._M_allocated_capacity & 0xffffffffffffff00
  ;
  depfile._M_dataplus._M_p = (pointer)&depfile.field_2;
  depfile._M_string_length = 0;
  depfile.field_2._M_allocated_capacity = depfile.field_2._M_allocated_capacity & 0xffffffffffffff00
  ;
  cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
  cldeps._M_string_length = 0;
  cldeps.field_2._M_allocated_capacity = cldeps.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (iVar8 == 0) goto LAB_0031a8de;
  bVar7 = NeedDepTypeMSVC(this,lang);
  if (bVar7) {
    std::__cxx11::string::_M_replace((ulong)&deptype,0,(char *)deptype._M_string_length,0x55d509);
    depfile._M_string_length = 0;
    *depfile._M_dataplus._M_p = '\0';
    std::__cxx11::string::append((char *)&flags);
    goto LAB_0031a8de;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                 "CMAKE_NINJA_CMCLDEPS_",lang);
  bVar7 = cmMakefile::IsOn(this_00,(string *)&comment);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_5e8) {
    operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
  }
  if (bVar7) {
    bVar7 = cmMakefile::GetIsSourceFileTryCompile(this_00);
    if (bVar7) goto LAB_0031a8de;
    std::__cxx11::string::_M_replace((ulong)&deptype,0,(char *)deptype._M_string_length,0x55d884);
    std::__cxx11::string::_M_replace((ulong)&depfile,0,(char *)depfile._M_string_length,0x55d781);
    _description = (pointer)local_430;
    std::__cxx11::string::_M_construct<char_const*>((string *)&description,"CMAKE_C_COMPILER","");
    pcVar13 = cmMakefile::GetDefinition(this_00,(string *)&description);
    ppRspFile._M_dataplus._M_p = (pointer)&ppRspFile.field_2;
    if (pcVar13 == (char *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"CMAKE_CXX_COMPILER","");
      psVar11 = cmMakefile::GetSafeDefinition(this_00,&ppRspFile);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"CMAKE_C_COMPILER","");
      psVar11 = cmMakefile::GetSafeDefinition(this_00,&ppRspFile);
    }
    _comment = (pointer)local_5e8;
    pcVar4 = (psVar11->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&comment,pcVar4,pcVar4 + psVar11->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != &ppRspFile.field_2) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&cldeps,0,(char *)cldeps._M_string_length,0x564d83);
    psVar11 = cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
    std::__cxx11::string::_M_append((char *)&cldeps,(ulong)(psVar11->_M_dataplus)._M_p);
    std::operator+(&ppCmdLine,"\" ",lang);
    plVar12 = (long *)std::__cxx11::string::append((char *)&ppCmdLine);
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      cmdLine.field_2._M_allocated_capacity = *psVar18;
      cmdLine.field_2._8_8_ = plVar12[3];
      cmdLine._M_dataplus._M_p = (pointer)&cmdLine.field_2;
    }
    else {
      cmdLine.field_2._M_allocated_capacity = *psVar18;
      cmdLine._M_dataplus._M_p = (pointer)*plVar12;
    }
    cmdLine._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&cmdLine);
    paVar17 = &compilerLauncher.field_2;
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      compilerLauncher.field_2._M_allocated_capacity = *psVar18;
      compilerLauncher.field_2._8_8_ = plVar12[3];
      compilerLauncher._M_dataplus._M_p = (pointer)paVar17;
    }
    else {
      compilerLauncher.field_2._M_allocated_capacity = *psVar18;
      compilerLauncher._M_dataplus._M_p = (pointer)*plVar12;
    }
    compilerLauncher._M_string_length = plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&compilerLauncher);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar20) {
      local_430[0]._0_8_ = paVar20->_M_allocated_capacity;
      local_430[0]._8_8_ = plVar12[3];
      _description = (pointer)local_430;
    }
    else {
      local_430[0]._0_8_ = paVar20->_M_allocated_capacity;
      _description = (pointer)*plVar12;
    }
    *plVar12 = (long)paVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&cldeps,(ulong)_description);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compilerLauncher._M_dataplus._M_p != paVar17) {
      operator_delete(compilerLauncher._M_dataplus._M_p,
                      compilerLauncher.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
      operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppCmdLine._M_dataplus._M_p != &ppCmdLine.field_2) {
      operator_delete(ppCmdLine._M_dataplus._M_p,ppCmdLine.field_2._M_allocated_capacity + 1);
    }
    _description = (pointer)local_430;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&description,"CMAKE_CL_SHOWINCLUDES_PREFIX","");
    psVar11 = cmMakefile::GetSafeDefinition(this_00,(string *)&description);
    std::__cxx11::string::_M_append((char *)&cldeps,(ulong)(psVar11->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    std::operator+(&compilerLauncher,"\" \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
    plVar12 = (long *)std::__cxx11::string::append((char *)&compilerLauncher);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar20) {
      local_430[0]._0_8_ = paVar20->_M_allocated_capacity;
      local_430[0]._8_8_ = plVar12[3];
      _description = (pointer)local_430;
    }
    else {
      local_430[0]._0_8_ = paVar20->_M_allocated_capacity;
      _description = (pointer)*plVar12;
    }
    *plVar12 = (long)paVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&cldeps,(ulong)_description);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    uVar21 = compilerLauncher.field_2._M_allocated_capacity;
    _Var23._M_p = compilerLauncher._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compilerLauncher._M_dataplus._M_p != paVar17) goto LAB_0031a8b1;
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&deptype,0,(char *)deptype._M_string_length,0x55d884);
    std::__cxx11::string::_M_replace((ulong)&depfile,0,(char *)depfile._M_string_length,0x55d781);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   "CMAKE_DEPFILE_FLAGS_",lang);
    psVar11 = cmMakefile::GetSafeDefinition(this_00,(string *)&comment);
    pcVar4 = (psVar11->_M_dataplus)._M_p;
    _description = (pointer)local_430;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&description,pcVar4,pcVar4 + psVar11->_M_string_length);
    if (local_438 != 0) {
      cmsys::SystemTools::ReplaceString((string *)&description,"<DEPFILE>","$DEP_FILE");
      cmsys::SystemTools::ReplaceString((string *)&description,"<OBJECT>","$out");
      paVar17 = &ppRspFile.field_2;
      ppRspFile._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"CMAKE_C_COMPILER","");
      pcVar13 = cmMakefile::GetDefinition(this_00,&ppRspFile);
      cmsys::SystemTools::ReplaceString((string *)&description,"<CMAKE_C_COMPILER>",pcVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar17) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&ppRspFile," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &description);
      std::__cxx11::string::_M_append((char *)&flags,(ulong)ppRspFile._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar17) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
    }
    uVar21 = local_430[0]._M_allocated_capacity;
    _Var23._M_p = _description;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
LAB_0031a8b1:
      operator_delete(_Var23._M_p,uVar21 + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_5e8) {
    operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
  }
LAB_0031a8de:
  vars.Flags = flags._M_dataplus._M_p;
  vars.DependencyFile = depfile._M_dataplus._M_p;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = std::__cxx11::string::compare((char *)lang);
  if (iVar8 == 0) {
    _comment = (pointer)local_5e8;
    local_5e8[0]._M_allocated_capacity = local_5e8[0]._M_allocated_capacity & 0xffffffffffffff00;
    pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    _description = (pointer)local_430;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&description,"CUDA_SEPARABLE_COMPILATION","");
    bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)&description);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    if (bVar7) {
      pcVar13 = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    }
    else {
      pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      _description = (pointer)local_430;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&description,"CUDA_PTX_COMPILATION","");
      bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)&description);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_430) {
        operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
      }
      pcVar13 = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
      if (bVar7) {
        pcVar13 = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
      }
    }
    std::__cxx11::string::_M_replace((ulong)&comment,0,(char *)0x0,(ulong)pcVar13);
    psVar11 = cmMakefile::GetRequiredDefinition(this_00,(string *)&comment);
    cmSystemTools::ExpandListArgument(psVar11,&compileCmds,false);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,"CMAKE_",lang);
    plVar12 = (long *)std::__cxx11::string::append((char *)&description);
    _comment = (pointer)local_5e8;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar17) {
      local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_5e8[0]._8_8_ = plVar12[3];
    }
    else {
      local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
      _comment = (pointer)*plVar12;
    }
    *plVar12 = (long)paVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    psVar11 = cmMakefile::GetRequiredDefinition(this_00,(string *)&comment);
    cmSystemTools::ExpandListArgument(psVar11,&compileCmds,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_5e8) {
    operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
  }
  compilerLauncher._M_dataplus._M_p = (pointer)&compilerLauncher.field_2;
  compilerLauncher._M_string_length = 0;
  compilerLauncher.field_2._M_allocated_capacity =
       compilerLauncher.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((iVar8 = std::__cxx11::string::compare((char *)lang), iVar8 == 0 ||
       (iVar8 = std::__cxx11::string::compare((char *)lang), iVar8 == 0)) ||
      ((iVar8 = std::__cxx11::string::compare((char *)lang), iVar8 == 0 ||
       (iVar8 = std::__cxx11::string::compare((char *)lang), iVar8 == 0)))))) {
    _comment = (pointer)local_5e8;
    pcVar4 = (lang->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&comment,pcVar4,pcVar4 + lang->_M_string_length);
    std::__cxx11::string::append((char *)&comment);
    pcVar13 = cmGeneratorTarget::GetProperty
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&comment);
    sVar5 = compilerLauncher._M_string_length;
    if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
      strlen(pcVar13);
      std::__cxx11::string::_M_replace((ulong)&compilerLauncher,0,(char *)sVar5,(ulong)pcVar13);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_5e8) {
      operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
    }
  }
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((iVar8 = std::__cxx11::string::compare((char *)lang), iVar8 == 0 ||
      (iVar8 = std::__cxx11::string::compare((char *)lang), iVar8 == 0)))) {
    _comment = (pointer)local_5e8;
    pcVar4 = (lang->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&comment,pcVar4,pcVar4 + lang->_M_string_length);
    std::__cxx11::string::append((char *)&comment);
    pcVar13 = cmGeneratorTarget::GetProperty
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&comment);
    pcVar4 = (lang->_M_dataplus)._M_p;
    _description = (pointer)local_430;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&description,pcVar4,pcVar4 + lang->_M_string_length);
    std::__cxx11::string::append((char *)&description);
    __s = cmGeneratorTarget::GetProperty
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&description);
    cmdLine._M_dataplus._M_p = (pointer)&cmdLine.field_2;
    pcVar4 = (lang->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&cmdLine,pcVar4,pcVar4 + lang->_M_string_length);
    std::__cxx11::string::append((char *)&cmdLine);
    __s_00 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,&cmdLine);
    ppCmdLine._M_dataplus._M_p = (pointer)&ppCmdLine.field_2;
    pcVar4 = (lang->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ppCmdLine,pcVar4,pcVar4 + lang->_M_string_length);
    std::__cxx11::string::append((char *)&ppCmdLine);
    __s_01 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,&ppCmdLine);
    if (((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) ||
       ((((__s != (char *)0x0 && (*__s != '\0')) || ((__s_00 != (char *)0x0 && (*__s_00 != '\0'))))
        || ((__s_01 != (char *)0x0 && (*__s_01 != '\0')))))) {
      pcVar2 = this->LocalGenerator;
      psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                (&run_iwyu,
                 &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,psVar11,SHELL);
      std::__cxx11::string::append((char *)&run_iwyu);
      if (compilerLauncher._M_string_length != 0) {
        std::__cxx11::string::append((char *)&run_iwyu);
        cmOutputConverter::EscapeForShell
                  (&local_7c8,
                   &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&compilerLauncher,false,false,false);
        std::__cxx11::string::_M_append((char *)&run_iwyu,(ulong)local_7c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        compilerLauncher._M_string_length = 0;
        *compilerLauncher._M_dataplus._M_p = '\0';
      }
      if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar2 = this->LocalGenerator;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        sVar16 = strlen(pcVar13);
        std::__cxx11::string::_M_construct<char_const*>((string *)&__str,pcVar13,pcVar13 + sVar16);
        cmOutputConverter::EscapeForShell
                  (&local_7c8,
                   &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&__str,false,false,false);
        std::__cxx11::string::_M_append((char *)&run_iwyu,(ulong)local_7c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
      }
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar2 = this->LocalGenerator;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        sVar16 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&__str,__s,__s + sVar16);
        cmOutputConverter::EscapeForShell
                  (&local_7c8,
                   &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&__str,false,false,false);
        std::__cxx11::string::_M_append((char *)&run_iwyu,(ulong)local_7c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
      }
      if ((__s_00 != (char *)0x0) && (*__s_00 != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar2 = this->LocalGenerator;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        sVar16 = strlen(__s_00);
        std::__cxx11::string::_M_construct<char_const*>((string *)&__str,__s_00,__s_00 + sVar16);
        cmOutputConverter::EscapeForShell
                  (&local_7c8,
                   &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&__str,false,false,false);
        std::__cxx11::string::_M_append((char *)&run_iwyu,(ulong)local_7c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
      }
      if ((__s_01 != (char *)0x0) && (*__s_01 != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar2 = this->LocalGenerator;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        sVar16 = strlen(__s_01);
        std::__cxx11::string::_M_construct<char_const*>((string *)&__str,__s_01,__s_01 + sVar16);
        cmOutputConverter::EscapeForShell
                  (&local_7c8,
                   &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&__str,false,false,false);
        std::__cxx11::string::_M_append((char *)&run_iwyu,(ulong)local_7c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
      }
      if ((((__s != (char *)0x0) && (*__s != '\0')) ||
          ((__s_00 != (char *)0x0 && (*__s_00 != '\0')))) ||
         ((__s_01 != (char *)0x0 && (*__s_01 != '\0')))) {
        std::__cxx11::string::append((char *)&run_iwyu);
      }
      std::__cxx11::string::append((char *)&run_iwyu);
      std::__cxx11::string::replace
                ((ulong)compileCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,
                 (ulong)run_iwyu._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)run_iwyu._M_dataplus._M_p != &run_iwyu.field_2) {
        operator_delete(run_iwyu._M_dataplus._M_p,run_iwyu.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppCmdLine._M_dataplus._M_p != &ppCmdLine.field_2) {
      operator_delete(ppCmdLine._M_dataplus._M_p,ppCmdLine.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
      operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_5e8) {
      operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
    }
  }
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (compilerLauncher._M_string_length != 0)) {
    cmdLine._M_dataplus._M_p = (pointer)0x0;
    cmdLine._M_string_length = 0;
    cmdLine.field_2._M_allocated_capacity = 0;
    cmSystemTools::ExpandListArgument
              (&compilerLauncher,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cmdLine,true);
    sVar5 = cmdLine._M_string_length;
    if (cmdLine._M_dataplus._M_p != (pointer)cmdLine._M_string_length) {
      _Var23 = cmdLine._M_dataplus;
      do {
        cmOutputConverter::EscapeForShell
                  ((string *)&comment,
                   &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)_Var23._M_p,false,false,false);
        std::__cxx11::string::operator=((string *)_Var23._M_p,(string *)&comment);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_comment != local_5e8) {
          operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
        }
        _Var23._M_p = _Var23._M_p + 0x20;
      } while (_Var23._M_p != (pointer)sVar5);
    }
    pbVar6 = compileCmds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&description,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cmdLine," ");
    plVar12 = (long *)std::__cxx11::string::append((char *)&description);
    _comment = (pointer)local_5e8;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar17) {
      local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_5e8[0]._8_8_ = plVar12[3];
    }
    else {
      local_5e8[0]._0_8_ = paVar17->_M_allocated_capacity;
      _comment = (pointer)*plVar12;
    }
    *plVar12 = (long)paVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::replace((ulong)pbVar6,0,(char *)0x0,(ulong)_comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_5e8) {
      operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_430) {
      operator_delete(_description,local_430[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cmdLine);
  }
  if (compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::replace
              ((ulong)compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,
               (ulong)cldeps._M_dataplus._M_p);
  }
  pbVar6 = compileCmds.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar24 = compileCmds.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     &launcher,pbVar24);
      std::__cxx11::string::operator=((string *)pbVar24,(string *)&comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_comment != local_5e8) {
        operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
      }
      pcVar22 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
      if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
        pcVar22 = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                ((cmRulePlaceholderExpander *)
                 rulePlaceholderExpander._M_t.
                 super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,pcVar22,
                 pbVar24,&vars);
      pbVar24 = pbVar24 + 1;
    } while (pbVar24 != pbVar6);
  }
  local_5e8[0]._M_allocated_capacity = local_5e8[0]._M_allocated_capacity & 0xffffffffffffff00;
  _comment = (pointer)local_5e8;
  cmLocalNinjaGenerator::BuildCommandLine
            (&cmdLine,this->LocalGenerator,&compileCmds,(string *)&comment,(cmGeneratorTarget *)0x0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_5e8) {
    operator_delete(_comment,local_5e8[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,"Rule for compiling ",0x13)
  ;
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&comment,(lang->_M_dataplus)._M_p,lang->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," files.",7);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&description,"Building ",9);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&description,(lang->_M_dataplus)._M_p,lang->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," object $out",0xc);
  pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  LanguageCompilerRule(&ppCmdLine,this,lang);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"");
  cmGlobalNinjaGenerator::AddRule
            (pcVar15,&ppCmdLine,&cmdLine,&run_iwyu,&local_7c8,&depfile,&deptype,&rspfile,&rspcontent
             ,&__str,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)run_iwyu._M_dataplus._M_p != &run_iwyu.field_2) {
    operator_delete(run_iwyu._M_dataplus._M_p,run_iwyu.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ppCmdLine._M_dataplus._M_p != &ppCmdLine.field_2) {
    operator_delete(ppCmdLine._M_dataplus._M_p,ppCmdLine.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
  std::ios_base::~ios_base(local_3d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
  std::ios_base::~ios_base(local_588);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
    operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compilerLauncher._M_dataplus._M_p != &compilerLauncher.field_2) {
    operator_delete(compilerLauncher._M_dataplus._M_p,
                    compilerLauncher.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&compileCmds);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cldeps._M_dataplus._M_p != &cldeps.field_2) {
    operator_delete(cldeps._M_dataplus._M_p,cldeps.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)depfile._M_dataplus._M_p != &depfile.field_2) {
    operator_delete(depfile._M_dataplus._M_p,depfile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)deptype._M_dataplus._M_p != &deptype.field_2) {
    operator_delete(deptype._M_dataplus._M_p,deptype.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspcontent._M_dataplus._M_p != &rspcontent.field_2) {
    operator_delete(rspcontent._M_dataplus._M_p,rspcontent.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,
                    CONCAT71(rspfile.field_2._M_allocated_capacity._1_7_,
                             rspfile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)launcher._M_dataplus._M_p != &launcher.field_2) {
    operator_delete(launcher._M_dataplus._M_p,
                    CONCAT71(launcher.field_2._M_allocated_capacity._1_7_,
                             launcher.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tdi._M_dataplus._M_p != &tdi.field_2) {
    operator_delete(tdi._M_dataplus._M_p,tdi.field_2._M_allocated_capacity + 1);
  }
  if ((__uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>)
      rulePlaceholderExpander._M_t.
      super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
      .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>)
      0x0) {
    std::default_delete<cmRulePlaceholderExpander>::operator()
              ((default_delete<cmRulePlaceholderExpander> *)&rulePlaceholderExpander,
               (cmRulePlaceholderExpander *)
               rulePlaceholderExpander._M_t.
               super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
               .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)responseFlag._M_dataplus._M_p != &responseFlag.field_2) {
    operator_delete(responseFlag._M_dataplus._M_p,
                    CONCAT71(responseFlag.field_2._M_allocated_capacity._1_7_,
                             responseFlag.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flags._M_dataplus._M_p != &flags.field_2) {
    operator_delete(flags._M_dataplus._M_p,flags.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";
  if (lang == "Swift") {
    vars.SwiftAuxiliarySources = "$SWIFT_AUXILIARY_SOURCES";
    vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
    vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
    vars.SwiftPartialModule = "$SWIFT_PARTIAL_MODULE";
    vars.SwiftPartialDoc = "$SWIFT_PARTIAL_DOC";
  }

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(lang);
  bool const needDyndep = this->NeedDyndep(lang);

  cmMakefile* mf = this->GetMakefile();

  std::string flags = "$FLAGS";

  std::string responseFlag;
  bool const lang_supports_response = !(lang == "RC" || lang == "CUDA");
  if (lang_supports_response && this->ForceResponseFile()) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    responseFlag = this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty()) {
      responseFlag = "@";
    }
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    ConvertToNinjaPath(this->GetTargetDependInfoPath(lang)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  const char* val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE");
  if (val && *val) {
    launcher = val;
    launcher += " ";
  }

  if (explicitPP) {
    // Lookup the explicit preprocessing rule.
    std::string const ppVar = "CMAKE_" + lang + "_PREPROCESS_SOURCE";
    std::string const& ppCmd =
      this->GetMakefile()->GetRequiredDefinition(ppVar);

    // Explicit preprocessing always uses a depfile.
    std::string const ppDeptype; // no deps= for multiple outputs
    std::string const ppDepfile = "$DEP_FILE";

    cmRulePlaceholderExpander::RuleVariables ppVars;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.CMTargetType = vars.CMTargetType;
    ppVars.Language = vars.Language;
    ppVars.Object = "$out"; // for RULE_LAUNCH_COMPILE
    ppVars.PreprocessedSource = "$out";
    ppVars.DependencyFile = ppDepfile.c_str();

    // Preprocessing uses the original source,
    // compilation uses preprocessed output.
    ppVars.Source = vars.Source;
    vars.Source = "$in";

    // Preprocessing and compilation use the same flags.
    std::string ppFlags = flags;

    // Move preprocessor definitions to the preprocessor rule.
    ppVars.Defines = vars.Defines;
    vars.Defines = "";

    // Copy include directories to the preprocessor rule.  The Fortran
    // compilation rule still needs them for the INCLUDE directive.
    ppVars.Includes = vars.Includes;

    // If using a response file, move defines, includes, and flags into it.
    std::string ppRspFile;
    std::string ppRspContent;
    if (!responseFlag.empty()) {
      ppRspFile = "$RSP_FILE";
      ppRspContent = std::string(" ") + ppVars.Defines + " " +
        ppVars.Includes + " " + ppFlags;
      ppFlags = responseFlag + ppRspFile;
      ppVars.Defines = "";
      ppVars.Includes = "";
    }

    ppVars.Flags = ppFlags.c_str();

    // Rule for preprocessing source file.
    std::vector<std::string> ppCmds;
    cmSystemTools::ExpandListArgument(ppCmd, ppCmds);

    for (std::string& i : ppCmds) {
      i = launcher + i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   i, ppVars);
    }

    // Run CMake dependency scanner on preprocessed output.
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ppCmds.push_back(
      cmake +
      " -E cmake_ninja_depends"
      " --tdi=" +
      tdi + " --lang=" + lang +
      " --pp=$out"
      " --dep=$DEP_FILE" +
      (needDyndep ? " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE" : ""));

    std::string const ppCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ppCmds);

    // Write the rule for preprocessing file of the given language.
    std::ostringstream ppComment;
    ppComment << "Rule for preprocessing " << lang << " files.";
    std::ostringstream ppDesc;
    ppDesc << "Building " << lang << " preprocessed $out";
    this->GetGlobalGenerator()->AddRule(
      this->LanguagePreprocessRule(lang), ppCmdLine, ppDesc.str(),
      ppComment.str(), ppDepfile, ppDeptype, ppRspFile, ppRspContent,
      /*restat*/ "",
      /*generator*/ false);
  }

  if (needDyndep) {
    // Write the rule for ninja dyndep file generation.
    std::vector<std::string> ddCmds;

    // Command line length is almost always limited -> use response file for
    // dyndep rules
    std::string ddRspFile = "$out.rsp";
    std::string ddRspContent = "$in";
    std::string ddInput = "@" + ddRspFile;

    // Run CMake dependency scanner on the source file (using the preprocessed
    // source if that was performed).
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ddCmds.push_back(cmake +
                     " -E cmake_ninja_dyndep"
                     " --tdi=" +
                     tdi + " --lang=" + lang +
                     " --dd=$out"
                     " " +
                     ddInput);

    std::string const ddCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ddCmds);

    std::ostringstream ddComment;
    ddComment << "Rule to generate ninja dyndep files for " << lang << ".";
    std::ostringstream ddDesc;
    ddDesc << "Generating " << lang << " dyndep file $out";
    this->GetGlobalGenerator()->AddRule(
      this->LanguageDyndepRule(lang), ddCmdLine, ddDesc.str(), ddComment.str(),
      /*depfile*/ "",
      /*deps*/ "", ddRspFile, ddRspContent,
      /*restat*/ "",
      /*generator*/ false);
  }

  // If using a response file, move defines, includes, and flags into it.
  std::string rspfile;
  std::string rspcontent;
  if (!responseFlag.empty()) {
    rspfile = "$RSP_FILE";
    rspcontent =
      std::string(" ") + vars.Defines + " " + vars.Includes + " " + flags;
    flags = responseFlag + rspfile;
    vars.Defines = "";
    vars.Includes = "";
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string deptype;
  std::string depfile;
  std::string cldeps;
  if (explicitPP) {
    // The explicit preprocessing step will handle dependency scanning.
  } else if (this->NeedDepTypeMSVC(lang)) {
    deptype = "msvc";
    depfile.clear();
    flags += " /showIncludes";
  } else if (mf->IsOn("CMAKE_NINJA_CMCLDEPS_" + lang)) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      deptype = "gcc";
      depfile = "$DEP_FILE";
      const std::string cl = mf->GetDefinition("CMAKE_C_COMPILER")
        ? mf->GetSafeDefinition("CMAKE_C_COMPILER")
        : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      cldeps = "\"";
      cldeps += cmSystemTools::GetCMClDepsCommand();
      cldeps += "\" " + lang + " " + vars.Source + " $DEP_FILE $out \"";
      cldeps += mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
      cldeps += "\" \"" + cl + "\" ";
    }
  } else {
    deptype = "gcc";
    depfile = "$DEP_FILE";
    const std::string flagsName = "CMAKE_DEPFILE_FLAGS_" + lang;
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      cmSystemTools::ReplaceString(depfileFlags, "<DEPFILE>", "$DEP_FILE");
      cmSystemTools::ReplaceString(depfileFlags, "<OBJECT>", "$out");
      cmSystemTools::ReplaceString(depfileFlags, "<CMAKE_C_COMPILER>",
                                   mf->GetDefinition("CMAKE_C_COMPILER"));
      flags += " " + depfileFlags;
    }
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = depfile.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (lang == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
    } else {
      cmdVar = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
    }
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar = "CMAKE_" + lang + "_COMPILE_OBJECT";
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  // See if we need to use a compiler launcher like ccache or distcc
  std::string compilerLauncher;
  if (!compileCmds.empty() &&
      (lang == "C" || lang == "CXX" || lang == "Fortran" || lang == "CUDA")) {
    std::string const clauncher_prop = lang + "_COMPILER_LAUNCHER";
    const char* clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    if (clauncher && *clauncher) {
      compilerLauncher = clauncher;
    }
  }

  // Maybe insert an include-what-you-use runner.
  if (!compileCmds.empty() && (lang == "C" || lang == "CXX")) {
    std::string const iwyu_prop = lang + "_INCLUDE_WHAT_YOU_USE";
    const char* iwyu = this->GeneratorTarget->GetProperty(iwyu_prop);
    std::string const tidy_prop = lang + "_CLANG_TIDY";
    const char* tidy = this->GeneratorTarget->GetProperty(tidy_prop);
    std::string const cpplint_prop = lang + "_CPPLINT";
    const char* cpplint = this->GeneratorTarget->GetProperty(cpplint_prop);
    std::string const cppcheck_prop = lang + "_CPPCHECK";
    const char* cppcheck = this->GeneratorTarget->GetProperty(cppcheck_prop);
    if ((iwyu && *iwyu) || (tidy && *tidy) || (cpplint && *cpplint) ||
        (cppcheck && *cppcheck)) {
      std::string run_iwyu = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
      run_iwyu += " -E __run_co_compile";
      if (!compilerLauncher.empty()) {
        // In __run_co_compile case the launcher command is supplied
        // via --launcher=<maybe-list> and consumed
        run_iwyu += " --launcher=";
        run_iwyu += this->LocalGenerator->EscapeForShell(compilerLauncher);
        compilerLauncher.clear();
      }
      if (iwyu && *iwyu) {
        run_iwyu += " --iwyu=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(iwyu);
      }
      if (tidy && *tidy) {
        run_iwyu += " --tidy=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(tidy);
      }
      if (cpplint && *cpplint) {
        run_iwyu += " --cpplint=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cpplint);
      }
      if (cppcheck && *cppcheck) {
        run_iwyu += " --cppcheck=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cppcheck);
      }
      if ((tidy && *tidy) || (cpplint && *cpplint) ||
          (cppcheck && *cppcheck)) {
        run_iwyu += " --source=$in";
      }
      run_iwyu += " -- ";
      compileCmds.front().insert(0, run_iwyu);
    }
  }

  // If compiler launcher was specified and not consumed above, it
  // goes to the beginning of the command line.
  if (!compileCmds.empty() && !compilerLauncher.empty()) {
    std::vector<std::string> args;
    cmSystemTools::ExpandListArgument(compilerLauncher, args, true);
    for (std::string& i : args) {
      i = this->LocalGenerator->EscapeForShell(i);
    }
    compileCmds.front().insert(0, cmJoin(args, " ") + " ");
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  for (std::string& i : compileCmds) {
    i = launcher + i;
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 vars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  // Write the rule for compiling file of the given language.
  std::ostringstream comment;
  comment << "Rule for compiling " << lang << " files.";
  std::ostringstream description;
  description << "Building " << lang << " object $out";
  this->GetGlobalGenerator()->AddRule(
    this->LanguageCompilerRule(lang), cmdLine, description.str(),
    comment.str(), depfile, deptype, rspfile, rspcontent,
    /*restat*/ "",
    /*generator*/ false);
}